

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

void generate_reset_token(st_quicly_default_encrypt_cid_t *self,void *token,void *cid)

{
  st_ptls_cipher_context_t *psVar1;
  ulong __n;
  uint __line;
  char *__assertion;
  uint8_t expandbuf [16];
  
  psVar1 = self->reset_token_ctx;
  if (psVar1->algo->block_size != 0x10) {
    __assertion = "self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN";
    __line = 99;
LAB_001142c9:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,__line,
                  "void generate_reset_token(struct st_quicly_default_encrypt_cid_t *, void *, const void *)"
                 );
  }
  __n = self->cid_encrypt_ctx->algo->block_size;
  if (__n != 0x10) {
    if (0xf < __n) {
      __assertion = "self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN";
      __line = 0x67;
      goto LAB_001142c9;
    }
    expandbuf[0] = '\0';
    expandbuf[1] = '\0';
    expandbuf[2] = '\0';
    expandbuf[3] = '\0';
    expandbuf[4] = '\0';
    expandbuf[5] = '\0';
    expandbuf[6] = '\0';
    expandbuf[7] = '\0';
    expandbuf[8] = '\0';
    expandbuf[9] = '\0';
    expandbuf[10] = '\0';
    expandbuf[0xb] = '\0';
    expandbuf[0xc] = '\0';
    expandbuf[0xd] = '\0';
    expandbuf[0xe] = '\0';
    expandbuf[0xf] = '\0';
    memcpy(expandbuf,cid,__n);
    cid = expandbuf;
  }
  (*psVar1->do_transform)(psVar1,token,cid,0x10);
  return;
}

Assistant:

static void generate_reset_token(struct st_quicly_default_encrypt_cid_t *self, void *token, const void *cid)
{
    uint8_t expandbuf[QUICLY_STATELESS_RESET_TOKEN_LEN];

    assert(self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN);

    /* expand the input to full size, if CID is shorter than the size of the reset token */
    if (self->cid_encrypt_ctx->algo->block_size != QUICLY_STATELESS_RESET_TOKEN_LEN) {
        assert(self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN);
        memset(expandbuf, 0, sizeof(expandbuf));
        memcpy(expandbuf, cid, self->cid_encrypt_ctx->algo->block_size);
        cid = expandbuf;
    }

    /* transform */
    ptls_cipher_encrypt(self->reset_token_ctx, token, cid, QUICLY_STATELESS_RESET_TOKEN_LEN);
}